

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O1

void __thiscall
trun::TestResponseProxy::ModuleDepends(TestResponseProxy *this,char *modName,char *dependencyList)

{
  TestRunner *this_00;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  this_00 = TestRunner::GetCurrentRunner();
  if (this_00 != (TestRunner *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,modName,&local_61);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,dependencyList,&local_62)
    ;
    TestRunner::AddDependenciesForModule(this_00,&local_40,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  gnilk::Log::Error<char_const*>(this->pLogger,"No test runner!");
  return;
}

Assistant:

void TestResponseProxy::ModuleDepends(const char *modName, const char *dependencyList) {
    auto ptrRunner = TestRunner::GetCurrentRunner();


    if (ptrRunner == nullptr) {
        pLogger->Error("No test runner!");
        return;
    }
    ptrRunner->AddDependenciesForModule(modName, dependencyList);
}